

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O3

int __thiscall VMState::PopJNZInstructionWithTarget(VMState *this,int address)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  int pos;
  
  piVar4 = (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)piVar4 - (long)piVar3;
  uVar6 = uVar5 >> 2;
  __n = (uVar5 & 0xfffffffc00000003) - 4;
  piVar3 = (pointer)((long)piVar3 + (uVar5 & 0x3fffffffc) + 4);
  do {
    piVar2 = piVar3;
    if ((int)uVar6 < 1) {
      return -1;
    }
    iVar1 = piVar2[-2];
    uVar6 = (ulong)((int)uVar6 - 1);
    piVar3 = piVar2 + -1;
    __n = __n + 4;
  } while ((this->m_Parent->m_Instructions).
           super__Vector_base<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar1].field_0.arg1 + iVar1 + 1 != address);
  if (piVar3 != piVar4) {
    memmove(piVar2 + -2,piVar3,__n);
    piVar4 = (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  (this->m_JNZInstructions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar4 + -1;
  return iVar1;
}

Assistant:

int PopJNZInstructionWithTarget( int address )
	{
		// Find last JNZ instruction that points at specified address (we need last to find
		// outermost do..while block)

		for( int i = (int)m_JNZInstructions.size() - 1; i >= 0; --i)
			if ((m_JNZInstructions[i] + 1 + m_Parent.m_Instructions[m_JNZInstructions[i]].arg1) == address)
			{
				int pos = m_JNZInstructions[i];
				m_JNZInstructions.erase(m_JNZInstructions.begin() + i);
				return pos;
			}

		return -1;
	}